

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEnc_InitPrices(CLzmaEnc *p)

{
  uint uVar1;
  CLzmaEnc *p_local;
  
  if (p->fastMode == 0) {
    FillDistancesPrices(p);
    FillAlignPrices(p);
  }
  uVar1 = p->numFastBytes - 1;
  (p->repLenEnc).tableSize = uVar1;
  (p->lenEnc).tableSize = uVar1;
  p->repLenEncCounter = 0x40;
  LenPriceEnc_UpdateTables(&p->lenEnc,1 << ((byte)p->pb & 0x1f),&p->lenProbs,p->ProbPrices);
  LenPriceEnc_UpdateTables(&p->repLenEnc,1 << ((byte)p->pb & 0x1f),&p->repLenProbs,p->ProbPrices);
  return;
}

Assistant:

static void LzmaEnc_InitPrices(CLzmaEnc *p)
{
  if (!p->fastMode)
  {
    FillDistancesPrices(p);
    FillAlignPrices(p);
  }

  p->lenEnc.tableSize =
  p->repLenEnc.tableSize =
      p->numFastBytes + 1 - LZMA_MATCH_LEN_MIN;

  p->repLenEncCounter = REP_LEN_COUNT;

  LenPriceEnc_UpdateTables(&p->lenEnc, (unsigned)1 << p->pb, &p->lenProbs, p->ProbPrices);
  LenPriceEnc_UpdateTables(&p->repLenEnc, (unsigned)1 << p->pb, &p->repLenProbs, p->ProbPrices);
}